

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O1

void xSAT_SolverCancelUntil(xSAT_Solver_t *s,int Level)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  xSAT_Heap_t *h;
  Vec_Int_t *p;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint Entry;
  
  if (s->vTrailLim->nSize <= Level) {
    return;
  }
  if (-1 < Level) {
    uVar6 = (ulong)(uint)s->vTrail->nSize;
    while (pVVar3 = s->vTrailLim, Level < pVVar3->nSize) {
      piVar4 = pVVar3->pArray;
      iVar2 = piVar4[(uint)Level];
      iVar5 = (int)uVar6;
      if (iVar5 <= iVar2) {
        s->iQhead = iVar2;
        iVar2 = piVar4[(uint)Level];
        if ((iVar2 <= s->vTrail->nSize) && (s->vTrail->nSize = iVar2, Level <= pVVar3->nSize)) {
          pVVar3->nSize = Level;
          return;
        }
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      if ((iVar5 < 1) || (s->vTrail->nSize < iVar5)) break;
      Entry = s->vTrail->pArray[uVar6 - 1] >> 1;
      if (((int)Entry < 0) || (s->vAssigns->nSize <= (int)Entry)) {
LAB_008f8bc8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      s->vAssigns->pArray[Entry] = '\x03';
      if (s->vReasons->nSize <= (int)Entry) goto LAB_008f8be7;
      s->vReasons->pArray[Entry] = -1;
      if (s->vTrail->nSize < iVar5) break;
      if (s->vPolarity->nSize <= (int)Entry) goto LAB_008f8bc8;
      s->vPolarity->pArray[Entry] = *(byte *)(s->vTrail->pArray + (uVar6 - 1)) & 1;
      h = s->hOrder;
      pVVar3 = h->vIndices;
      if ((pVVar3->nSize <= (int)Entry) || (pVVar3->pArray[Entry] < 0)) {
        if (pVVar3->nSize <= (int)Entry) {
          uVar1 = Entry + 1;
          iVar2 = pVVar3->nCap;
          uVar7 = iVar2 * 2;
          if ((int)Entry < (int)uVar7) {
            if (iVar2 < (int)uVar7 && iVar2 <= (int)Entry) {
              if (pVVar3->pArray == (int *)0x0) {
                piVar4 = (int *)malloc((long)iVar2 << 3);
              }
              else {
                piVar4 = (int *)realloc(pVVar3->pArray,(long)iVar2 << 3);
              }
              pVVar3->pArray = piVar4;
joined_r0x008f8ac4:
              if (piVar4 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar3->nCap = uVar7;
            }
          }
          else if (iVar2 <= (int)Entry) {
            if (pVVar3->pArray == (int *)0x0) {
              piVar4 = (int *)malloc((ulong)uVar1 << 2);
            }
            else {
              piVar4 = (int *)realloc(pVVar3->pArray,(ulong)uVar1 << 2);
            }
            pVVar3->pArray = piVar4;
            uVar7 = uVar1;
            goto joined_r0x008f8ac4;
          }
          iVar2 = pVVar3->nSize;
          if (iVar2 <= (int)Entry) {
            memset(pVVar3->pArray + iVar2,0xff,(ulong)(Entry - iVar2) * 4 + 4);
          }
          pVVar3->nSize = uVar1;
        }
        pVVar3 = h->vIndices;
        if (pVVar3->nSize <= (int)Entry) {
LAB_008f8be7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        if (-1 < pVVar3->pArray[Entry]) {
          __assert_fail("!xSAT_HeapInHeap( p, n )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatHeap.h"
                        ,0xe6,"void xSAT_HeapInsert(xSAT_Heap_t *, int)");
        }
        if (pVVar3->nSize <= (int)Entry) goto LAB_008f8be7;
        p = h->vHeap;
        pVVar3->pArray[Entry] = p->nSize;
        Vec_IntPush(p,Entry);
        if (h->vIndices->nSize <= (int)Entry) break;
        xSAT_HeapPercolateUp(h,h->vIndices->pArray[Entry]);
      }
      uVar6 = uVar6 - 1;
      if (Level < 0) break;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void xSAT_SolverCancelUntil( xSAT_Solver_t * s, int Level )
{
    int c;

    if ( xSAT_SolverDecisionLevel( s ) <= Level )
        return;

    for ( c = Vec_IntSize( s->vTrail ) - 1; c >= Vec_IntEntry( s->vTrailLim, Level ); c-- )
    {
        int Var = xSAT_Lit2Var( Vec_IntEntry( s->vTrail, c ) );

        Vec_StrWriteEntry( s->vAssigns, Var, VarX );
        Vec_IntWriteEntry( s->vReasons, Var, ( int ) CRefUndef );
        Vec_StrWriteEntry( s->vPolarity, Var, ( char )xSAT_LitSign( Vec_IntEntry( s->vTrail, c ) ) );

        if ( !xSAT_HeapInHeap( s->hOrder, Var ) )
            xSAT_HeapInsert( s->hOrder, Var );
    }

    s->iQhead = Vec_IntEntry( s->vTrailLim, Level );
    Vec_IntShrink( s->vTrail, Vec_IntEntry( s->vTrailLim, Level ) );
    Vec_IntShrink( s->vTrailLim, Level );
}